

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::NoteNewRevision(cmCTestHG *this)

{
  string *this_00;
  cmCTest *this_01;
  ostream *poVar1;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  GetWorkingRevision_abi_cxx11_((string *)&cmCTestLog_msg,this);
  this_00 = &(this->super_cmCTestGlobalVC).NewRevision;
  std::__cxx11::string::operator=((string *)this_00,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"   New revision of repository is: ");
  poVar1 = std::operator<<(poVar1,(string *)this_00);
  std::operator<<(poVar1,"\n");
  this_01 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_01,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHG.cxx"
               ,0x7b,local_1b0[0],false);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return true;
}

Assistant:

bool cmCTestHG::NoteNewRevision()
{
  this->NewRevision = this->GetWorkingRevision();
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   New revision of repository is: " << this->NewRevision
                                                  << "\n");
  return true;
}